

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rbbi.cpp
# Opt level: O0

void __thiscall
icu_63::RuleBasedBreakIterator::RuleBasedBreakIterator
          (RuleBasedBreakIterator *this,UnicodeString *rules,UParseError *parseError,
          UErrorCode *status)

{
  UBool UVar1;
  RuleBasedBreakIterator *that;
  RuleBasedBreakIterator *bi;
  UnicodeString local_68;
  EVP_PKEY_CTX *local_28;
  UErrorCode *status_local;
  UParseError *parseError_local;
  UnicodeString *rules_local;
  RuleBasedBreakIterator *this_local;
  
  local_28 = (EVP_PKEY_CTX *)status;
  status_local = &parseError->line;
  parseError_local = (UParseError *)rules;
  rules_local = (UnicodeString *)this;
  BreakIterator::BreakIterator(&this->super_BreakIterator);
  (this->super_BreakIterator).super_UObject._vptr_UObject =
       (_func_int **)&PTR__RuleBasedBreakIterator_004e5840;
  UnicodeString::UnicodeString(&local_68);
  StringCharacterIterator::StringCharacterIterator(&this->fSCharIter,&local_68);
  UnicodeString::~UnicodeString(&local_68);
  init(this,local_28);
  UVar1 = ::U_FAILURE(*(UErrorCode *)local_28);
  if (UVar1 == '\0') {
    that = (RuleBasedBreakIterator *)
           RBBIRuleBuilder::createRuleBasedBreakIterator
                     ((UnicodeString *)parseError_local,(UParseError *)status_local,
                      (UErrorCode *)local_28);
    UVar1 = ::U_SUCCESS(*(UErrorCode *)local_28);
    if ((UVar1 != '\0') && (operator=(this,that), that != (RuleBasedBreakIterator *)0x0)) {
      (*(that->super_BreakIterator).super_UObject._vptr_UObject[1])();
    }
  }
  return;
}

Assistant:

RuleBasedBreakIterator::RuleBasedBreakIterator( const UnicodeString  &rules,
                                                UParseError          &parseError,
                                                UErrorCode           &status)
 : fSCharIter(UnicodeString())
{
    init(status);
    if (U_FAILURE(status)) {return;}
    RuleBasedBreakIterator *bi = (RuleBasedBreakIterator *)
        RBBIRuleBuilder::createRuleBasedBreakIterator(rules, &parseError, status);
    // Note:  This is a bit awkward.  The RBBI ruleBuilder has a factory method that
    //        creates and returns a complete RBBI.  From here, in a constructor, we
    //        can't just return the object created by the builder factory, hence
    //        the assignment of the factory created object to "this".
    if (U_SUCCESS(status)) {
        *this = *bi;
        delete bi;
    }
}